

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

void NULLCCanvas::CanvasDrawPointA(double x,double y,double alpha,Canvas *ptr)

{
  uint x_00;
  uint y_00;
  double dVar1;
  double dVar2;
  uint yy;
  uint xx;
  Canvas *ptr_local;
  double alpha_local;
  double y_local;
  double x_local;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
  }
  else {
    x_00 = (uint)(long)x;
    y_00 = (uint)(long)y;
    if ((ptr->aaEnabled & 1U) == 0) {
      CanvasDrawPointInternal(x_00,y_00,alpha,ptr);
    }
    else {
      dVar1 = rfpart(x);
      dVar2 = rfpart(y);
      CanvasDrawPointInternal(x_00,y_00,alpha * dVar1 * dVar2,ptr);
      dVar1 = fpart(x);
      dVar2 = rfpart(y);
      CanvasDrawPointInternal(x_00 + 1,y_00,alpha * dVar1 * dVar2,ptr);
      dVar1 = rfpart(x);
      dVar2 = fpart(y);
      CanvasDrawPointInternal(x_00,y_00 + 1,alpha * dVar1 * dVar2,ptr);
      dVar1 = fpart(x);
      dVar2 = fpart(y);
      CanvasDrawPointInternal(x_00 + 1,y_00 + 1,alpha * dVar1 * dVar2,ptr);
    }
  }
  return;
}

Assistant:

void CanvasDrawPointA(double x, double y, double alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		unsigned xx = unsigned(x);
		unsigned yy = unsigned(y);
		if(ptr->aaEnabled)
		{
			CanvasDrawPointInternal(xx, yy, alpha * rfpart(x) * rfpart(y), ptr);
			CanvasDrawPointInternal(xx + 1, yy, alpha * fpart(x) * rfpart(y), ptr);
			CanvasDrawPointInternal(xx, yy + 1, alpha * rfpart(x) * fpart(y), ptr);
			CanvasDrawPointInternal(xx + 1, yy + 1, alpha * fpart(x) * fpart(y), ptr);
		}else{
			CanvasDrawPointInternal(xx, yy, alpha, ptr);
		}
	}